

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

int Curl_resolv(connectdata *conn,char *hostname,int port,Curl_dns_entry **entry)

{
  SessionHandle *data;
  _Bool _Var1;
  Curl_dns_entry *pCVar2;
  Curl_addrinfo *addr;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  int respwait;
  int stale;
  int local_44;
  Curl_dns_entry **local_40;
  int local_34;
  
  data = conn->data;
  *entry = (Curl_dns_entry *)0x0;
  local_40 = entry;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  pCVar2 = Curl_fetch_addr(conn,hostname,port,&local_34);
  pcVar3 = "NOT ";
  if (local_34 != 0) {
    pcVar3 = "";
  }
  if (pCVar2 != (Curl_dns_entry *)0x0) {
    pcVar3 = "";
  }
  Curl_infof(data,"Hostname was %sfound in DNS cache\n",pcVar3);
  if (local_34 != 0) {
    Curl_infof(data,"Hostname in DNS cache was stale, zapped\n");
  }
  if (pCVar2 == (Curl_dns_entry *)0x0) {
    iVar4 = -1;
  }
  else {
    pCVar2->inuse = pCVar2->inuse + 1;
    iVar4 = 0;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  if (pCVar2 != (Curl_dns_entry *)0x0) goto LAB_00557f0e;
  _Var1 = Curl_ipvalid(conn);
  if (_Var1) {
    addr = Curl_getaddrinfo(conn,hostname,port,&local_44);
    if (addr == (Curl_addrinfo *)0x0) {
      bVar5 = local_44 == 0;
    }
    else {
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar2 = Curl_cache_addr(data,addr,hostname,port);
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      bVar5 = true;
      if (pCVar2 != (Curl_dns_entry *)0x0) {
        iVar4 = 0;
        goto LAB_00557f04;
      }
      Curl_freeaddrinfo(addr);
    }
    pCVar2 = (Curl_dns_entry *)0x0;
  }
  else {
    pCVar2 = (Curl_dns_entry *)0x0;
    bVar5 = false;
  }
LAB_00557f04:
  if (!bVar5) {
    return -1;
  }
LAB_00557f0e:
  *local_40 = pCVar2;
  return iVar4;
}

Assistant:

int Curl_resolv(struct connectdata *conn,
                const char *hostname,
                int port,
                struct Curl_dns_entry **entry)
{
  struct Curl_dns_entry *dns = NULL;
  struct SessionHandle *data = conn->data;
  CURLcode result;
  int stale, rc = CURLRESOLV_ERROR; /* default to failure */

  *entry = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = Curl_fetch_addr(conn, hostname, port, &stale);

  infof(data, "Hostname was %sfound in DNS cache\n", dns||stale?"":"NOT ");
  if(stale)
    infof(data, "Hostname in DNS cache was stale, zapped\n");


  if(dns) {
    dns->inuse++; /* we use it! */
    rc = CURLRESOLV_RESOLVED;
  }

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  if(!dns) {
    /* The entry was not in the cache. Resolve it to IP address */

    Curl_addrinfo *addr;
    int respwait;

    /* Check what IP specifics the app has requested and if we can provide it.
     * If not, bail out. */
    if(!Curl_ipvalid(conn))
      return CURLRESOLV_ERROR;

    /* If Curl_getaddrinfo() returns NULL, 'respwait' might be set to a
       non-zero value indicating that we need to wait for the response to the
       resolve call */
    addr = Curl_getaddrinfo(conn,
#ifdef DEBUGBUILD
                            (data->set.str[STRING_DEVICE]
                             && !strcmp(data->set.str[STRING_DEVICE],
                                        "LocalHost"))?"localhost":
#endif
                            hostname, port, &respwait);

    if(!addr) {
      if(respwait) {
        /* the response to our resolve call will come asynchronously at
           a later time, good or bad */
        /* First, check that we haven't received the info by now */
        result = Curl_resolver_is_resolved(conn, &dns);
        if(result) /* error detected */
          return CURLRESOLV_ERROR;
        if(dns)
          rc = CURLRESOLV_RESOLVED; /* pointer provided */
        else
          rc = CURLRESOLV_PENDING; /* no info yet */
      }
    }
    else {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, addr, hostname, port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(addr);
      else
        rc = CURLRESOLV_RESOLVED;
    }
  }

  *entry = dns;

  return rc;
}